

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.c
# Opt level: O2

void decStatus(decNumber_conflict *dn,uint32_t status,decContext *set)

{
  if ((status & 0xdd) != 0) {
    if ((status >> 0x1e & 1) == 0) {
      dn->digits = 1;
      dn->exponent = 0;
      dn->lsu[0] = 0;
      dn->bits = ' ';
    }
    else {
      status = status & 0xbfffffff;
    }
  }
  decContextSetStatus(set,status);
  return;
}

Assistant:

static void decStatus(decNumber *dn, uInt status, decContext *set) {
  if (status & DEC_NaNs) {		/* error status -> NaN */
    /* if cause was an sNaN, clear and propagate [NaN is already set up] */
    if (status & DEC_sNaN) status&=~DEC_sNaN;
     else {
      decNumberZero(dn);		/* other error: clean throughout */
      dn->bits=DECNAN;			/* and make a quiet NaN */
      }
    }
  decContextSetStatus(set, status);	/* [may not return] */
  return;
  }